

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ProxyConfig *this;
  DNSCache *this_00;
  undefined1 local_760 [8];
  ProxyClient client;
  char **argv_local;
  int argc_local;
  
  client.m_sessionDataMap._M_h._M_single_bucket = (__node_base_ptr)argv;
  this = ProxyConfig::getInstance();
  bVar1 = ProxyConfig::initWithArgs
                    (this,argc,(char **)client.m_sessionDataMap._M_h._M_single_bucket);
  if (bVar1) {
    net_uv::net_setLogLevel(1);
    this_00 = net_uv::DNSCache::getInstance();
    net_uv::DNSCache::setEnable(this_00,true);
    ProxyClient::ProxyClient((ProxyClient *)local_760);
    bVar1 = ProxyClient::start((ProxyClient *)local_760);
    if (!bVar1) {
      printf("start fail...\n");
    }
    ProxyClient::~ProxyClient((ProxyClient *)local_760);
    net_uv::printMemInfo();
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
	if (!ProxyConfig::getInstance()->initWithArgs(argc, argv))
		return -1;

	net_uv::net_setLogLevel(NET_UV_L_INFO);
	net_uv::DNSCache::getInstance()->setEnable(true);
	{
		ProxyClient client;
		
		if (!client.start())
		{
			printf("start fail...\n");
		}
	}
	printMemInfo();
	return 0;
}